

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O1

void anon_unknown.dwarf_288147::readValidateFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo)

{
  Slice *pSVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  half *phVar5;
  int *piVar6;
  half *phVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int pWidth_local;
  int pHeight_local;
  half *local_120;
  undefined8 local_118;
  undefined8 local_110;
  ulong local_108;
  int local_fc;
  InputFile lFile;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  Array2D<Imath_3_2::half> lPixels;
  Array2D<Imath_3_2::half> lPixelsLeft;
  FrameBuffer lInputFrameBuffer;
  Slice local_68 [56];
  
  if (pImageType == IMAGE_TYPE_RGB) {
    local_118 = 3;
  }
  else {
    if (pImageType == IMAGE_TYPE_OTHER) {
      local_118 = 2;
      local_110 = CONCAT44(local_110._4_4_,1);
      goto LAB_0018b0d6;
    }
    local_118 = 4;
  }
  local_110 = (ulong)local_110._4_4_ << 0x20;
LAB_0018b0d6:
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  lVar10 = (long)pHeight;
  lVar8 = (long)(pWidth * (int)local_118);
  uVar9 = 0xffffffffffffffff;
  if (-1 < lVar8 * lVar10) {
    uVar9 = lVar8 * lVar10 * 2;
  }
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  phVar5 = (half *)operator_new__(uVar9);
  if (lPixels._data != (half *)0x0) {
    operator_delete__(lPixels._data);
  }
  lPixels._sizeX = lVar10;
  lPixels._sizeY = lVar8;
  lPixels._data = phVar5;
  if (pIsStereo) {
    lPixelsLeft._sizeX = 0;
    lPixelsLeft._sizeY = 0;
    lPixelsLeft._data = (half *)0x0;
    local_120 = (half *)operator_new__(uVar9);
    if (lPixelsLeft._data != (half *)0x0) {
      operator_delete__(lPixelsLeft._data);
    }
    lPixelsLeft._data = local_120;
    lPixelsLeft._sizeX = lVar10;
    lPixelsLeft._sizeY = lVar8;
    iVar4 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile(&lFile,pFilename,iVar4);
    Imf_3_4::InputFile::header();
    piVar6 = (int *)Imf_3_4::Header::dataWindow();
    iVar4 = piVar6[1];
    local_fc = piVar6[3];
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_108 = (ulong)(uint)((int)local_118 * 2);
    uVar9 = (long)((piVar6[2] - *piVar6) + 1) * local_108;
    local_110 = (ulong)(uint)((int)local_118 * 8);
    uVar11 = 0;
    phVar7 = local_120;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar1 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES + uVar11);
      Imf_3_4::Slice::Slice
                (local_68,HALF,(char *)phVar5,local_108,uVar9,1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_4::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar1);
      pSVar1 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + uVar11);
      Imf_3_4::Slice::Slice
                (local_68,HALF,(char *)phVar7,local_108,uVar9,1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_4::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar1);
      uVar11 = uVar11 + 8;
      phVar7 = phVar7 + 1;
      phVar5 = phVar5 + 1;
    } while (local_110 != uVar11);
    Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&lFile);
    Imf_3_4::InputFile::readPixels((int)&lFile,iVar4);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&lInputFrameBuffer);
    uVar2 = local_118;
    if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
    }
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,(int)uVar2,false);
    validatePixels(&pHeight_local,&pWidth_local,&lPixelsLeft,(int)local_118,true);
    operator_delete__(local_120);
  }
  else {
    iVar4 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile(&lFile,pFilename,iVar4);
    Imf_3_4::InputFile::header();
    piVar6 = (int *)Imf_3_4::Header::dataWindow();
    local_120 = (half *)CONCAT44(local_120._4_4_,piVar6[1]);
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar4 = (int)local_118;
    local_108 = (ulong)(uint)(iVar4 * 2);
    uVar11 = (long)((piVar6[2] - *piVar6) + 1) * local_108;
    uVar9 = 0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar1 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES + uVar9);
      Imf_3_4::Slice::Slice
                (local_68,HALF,(char *)phVar5,local_108,uVar11,1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_4::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar1);
      uVar9 = uVar9 + 8;
      phVar5 = phVar5 + 1;
    } while ((uint)(iVar4 * 8) != uVar9);
    Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&lFile);
    cVar3 = Imf_3_4::InputFile::isOptimizationEnabled();
    uVar2 = local_118;
    if (cVar3 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," optimization disabled\n",0x17);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," optimization enabled\n",0x16);
      if ((char)local_110 != '\0') {
        std::operator<<((ostream *)&std::cerr,
                        " error: isOptimizationEnabled returned TRUE, but optimization not known to work for two channel images\n"
                       );
        __assert_fail("pNbChannels != 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testOptimized.cpp"
                      ,0x14a,
                      "void (anonymous namespace)::readPixels(const char *, int, Array2D<half> &)");
      }
    }
    Imf_3_4::InputFile::readPixels((int)&lFile,(int)local_120);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&lInputFrameBuffer);
    if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
    }
    if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
    }
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,(int)uVar2,false);
  }
  if (lPixels._data != (half *)0x0) {
    operator_delete__(lPixels._data);
  }
  return;
}

Assistant:

void
readValidateFile (
    const char pFilename[],
    int        pHeight,
    int        pWidth,
    EImageType pImageType,
    bool       pIsStereo)
{
    const int lNbChannels = getNbChannels (pImageType);

    Array2D<half> lPixels;
    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    //readPixels(pFilename, lNbChannels, lPixels);
    //writePixels("pkTest.exr", pHeight, pWidth, lPixels, lNbChannels, NO_COMPRESSION);

    if (pIsStereo)
    {
        Array2D<half> lPixelsLeft;
        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        readPixels (pFilename, lNbChannels, lPixels, lPixelsLeft);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
        validatePixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);
    }
    else
    {
        readPixels (pFilename, lNbChannels, lPixels);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
    }
}